

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * __thiscall
cmGeneratorExpressionInterpreter::Evaluate
          (cmGeneratorExpressionInterpreter *this,char *expression,string *property)

{
  cmGeneratorTarget *target;
  bool bVar1;
  pointer this_00;
  string *psVar2;
  bool local_de;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  string *property_local;
  char *expression_local;
  cmGeneratorExpressionInterpreter *this_local;
  
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&dagChecker.CheckResult,(char *)this);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  operator=(&this->CompiledGeneratorExpression,
            (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             *)&dagChecker.CheckResult);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&dagChecker.CheckResult);
  target = this->HeadTarget;
  bVar1 = std::operator==(property,"COMPILE_FLAGS");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"COMPILE_OPTIONS",&local_c9);
  }
  else {
    std::__cxx11::string::string((string *)&local_c8,(string *)property);
  }
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_a8,target,&local_c8,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  else {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  this_00 = std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::operator->(&this->CompiledGeneratorExpression);
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,this->LocalGenerator,&this->Config,false,this->HeadTarget,
                      (cmGeneratorExpressionDAGChecker *)local_a8,&this->Language);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_a8);
  return psVar2;
}

Assistant:

const std::string& cmGeneratorExpressionInterpreter::Evaluate(
  const char* expression, const std::string& property)
{
  this->CompiledGeneratorExpression =
    this->GeneratorExpression.Parse(expression);

  // Specify COMPILE_OPTIONS to DAGchecker, same semantic as COMPILE_FLAGS
  cmGeneratorExpressionDAGChecker dagChecker(
    this->HeadTarget,
    property == "COMPILE_FLAGS" ? "COMPILE_OPTIONS" : property, nullptr,
    nullptr);

  return this->CompiledGeneratorExpression->Evaluate(
    this->LocalGenerator, this->Config, false, this->HeadTarget, &dagChecker,
    this->Language);
}